

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

void shim_vkGetDeviceQueue
               (VkDevice device,uint32_t queueFamilyIndex,uint32_t queueIndex,VkQueue *pQueue)

{
  ulong uVar1;
  pointer pPVar2;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_> _Var3;
  ulong uVar4;
  pointer pPVar5;
  VkDevice local_38;
  
  pPVar2 = mock.physical_devices_details.
           super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (mock.physical_devices_details.
      super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      mock.physical_devices_details.
      super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = (ulong)queueFamilyIndex;
    pPVar5 = mock.physical_devices_details.
             super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = device;
    do {
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<VkDevice_T**,std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>,__gnu_cxx::__ops::_Iter_equals_val<VkDevice_T*const>>
                        (*(undefined8 *)&pPVar5->created_device_handles,
                         *(undefined8 *)&pPVar5->field_0x670,&local_38);
      if (((_Var3._M_current != *(VkDevice_T ***)&pPVar5->field_0x670) &&
          (uVar4 = (*(long *)&pPVar5->field_0x640 - *(long *)&pPVar5->queue_family_properties >> 3)
                   * -0x5555555555555555, uVar1 <= uVar4 && uVar4 - uVar1 != 0)) &&
         (queueIndex < *(uint *)(*(long *)&pPVar5->queue_family_properties + 4 + uVar1 * 0x18))) {
        *pQueue = (VkQueue)(ulong)(queueIndex + 0xccee);
        return;
      }
      pPVar5 = pPVar5 + 1;
    } while (pPVar5 != pPVar2);
  }
  return;
}

Assistant:

VKAPI_ATTR void VKAPI_CALL shim_vkGetDeviceQueue(VkDevice device, uint32_t queueFamilyIndex, uint32_t queueIndex, VkQueue* pQueue) {
    for (auto& physical_devices : mock.physical_devices_details) {
        auto it = std::find(
            std::begin(physical_devices.created_device_handles), std::end(physical_devices.created_device_handles), device);
        if (it != std::end(physical_devices.created_device_handles)) {
            if (queueFamilyIndex < physical_devices.queue_family_properties.size() &&
                queueIndex < physical_devices.queue_family_properties[queueFamilyIndex].queueCount) {
                *pQueue = get_handle<VkQueue>(0x0000CCEEU + queueIndex);
                return;
            }
        }
    }
}